

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O0

void __thiscall
libtorrent::mmap_disk_io::async_hash
          (mmap_disk_io *this,storage_index_t storage,piece_index_t piece,
          span<libtorrent::digest32<256L>_> v2,disk_job_flags_t flags,
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&)>
          *handler)

{
  __shared_ptr_access<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  mmap_disk_job *j_00;
  digest32<160L> local_68;
  uint local_54;
  enable_shared_from_this<libtorrent::aux::mmap_storage> local_50;
  disk_job_flags_t local_39;
  mmap_disk_job *local_38;
  mmap_disk_job *j;
  mmap_disk_io *this_local;
  undefined1 auStack_20 [7];
  disk_job_flags_t flags_local;
  span<libtorrent::digest32<256L>_> v2_local;
  piece_index_t piece_local;
  storage_index_t storage_local;
  
  v2_local.m_ptr = (digest32<256L> *)v2.m_len;
  _auStack_20 = v2.m_ptr;
  local_54 = storage.m_val;
  local_39.m_val = flags.m_val;
  j = (mmap_disk_job *)this;
  this_local._7_1_ = flags.m_val;
  v2_local.m_len._0_4_ = piece.m_val;
  v2_local.m_len._4_4_ = storage.m_val;
  this_00 = (__shared_ptr_access<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)libtorrent::aux::storage_array<libtorrent::aux::mmap_storage>::operator[]
                         (&this->m_torrents,storage);
  ::std::
  __shared_ptr_access<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(this_00);
  ::std::enable_shared_from_this<libtorrent::aux::mmap_storage>::shared_from_this(&local_50);
  digest32<160L>::digest32(&local_68);
  j_00 = libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
         allocate_job<libtorrent::aux::job::hash,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,libtorrent::span<libtorrent::digest32<256l>>const&,libtorrent::digest32<160l>>
                   (&this->m_job_pool,local_39,
                    (shared_ptr<libtorrent::aux::mmap_storage> *)&local_50,handler,
                    (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&v2_local.m_len,
                    (span<libtorrent::digest32<256L>_> *)auStack_20,&local_68);
  ::std::shared_ptr<libtorrent::aux::mmap_storage>::~shared_ptr
            ((shared_ptr<libtorrent::aux::mmap_storage> *)&local_50);
  local_38 = j_00;
  add_job(this,j_00,true);
  return;
}

Assistant:

void mmap_disk_io::async_hash(storage_index_t const storage
		, piece_index_t const piece, span<sha256_hash> const v2, disk_job_flags_t const flags
		, std::function<void(piece_index_t, sha1_hash const&, storage_error const&)> handler)
	{
		TORRENT_ASSERT(valid_flags(flags));
		aux::mmap_disk_job* j = m_job_pool.allocate_job<aux::job::hash>(
			flags,
			m_torrents[storage]->shared_from_this(),
			std::move(handler),
			piece,
			v2,
			sha1_hash{}
		);
		add_job(j);
	}